

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_boundary.cpp
# Opt level: O2

idx_t duckdb::CSVIterator::BytesPerThread(CSVReaderOptions *reader_options)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (reader_options->maximum_line_size).value;
  uVar2 = (reader_options->buffer_size_option).value >> 2 & 0xfffffffffffffffc;
  if (uVar2 <= uVar1) {
    uVar2 = uVar1;
  }
  return uVar2;
}

Assistant:

idx_t CSVIterator::BytesPerThread(const CSVReaderOptions &reader_options) {
	const idx_t buffer_size = reader_options.buffer_size_option.GetValue();
	const idx_t max_row_size = reader_options.maximum_line_size.GetValue();
	const idx_t bytes_per_thread = buffer_size / CSVBuffer::ROWS_PER_BUFFER * ROWS_PER_THREAD;
	if (bytes_per_thread < max_row_size) {
		// If we are setting up the buffer size directly, we must make sure each thread will read the full buffer.
		return max_row_size;
	}
	return bytes_per_thread;
}